

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O1

SharedLocalization __thiscall ary::PlaneTracker::update(PlaneTracker *this,Mat *image)

{
  int id;
  undefined4 uVar1;
  undefined4 uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  PlanarLocalization *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  ulong uVar4;
  long lVar5;
  long lVar6;
  SharedLocalization SVar7;
  Matx<float,_3,_1> MVar8;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> image_points;
  vector<int,_std::allocator<int>_> inliers;
  Size2f local_2d0;
  vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> object_points;
  CameraModel *local_288;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_280;
  CameraModel *local_278;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_270;
  _InputArray local_268;
  PlanarLocalization *local_250;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_248;
  undefined8 uStack_240;
  undefined8 local_228;
  undefined8 uStack_220;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> updates;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> local_200;
  _InputArray local_1e8;
  _InputArray local_1d0;
  undefined1 local_1b8 [12];
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined8 local_158;
  Mat transVec;
  Mat rotVec;
  _OutputArray local_90;
  _OutputArray local_78;
  _OutputArray local_60;
  _InputArray local_48;
  
  *(int *)&image[4].u = *(int *)&image[4].u + 1;
  if ((ulong)((long)image->u - (long)image->allocator) < 0x50) {
    (this->super_CameraUser)._vptr_CameraUser = (_func_int **)0x0;
    (this->super_CameraUser).camera.super_shared_ptr<ary::CameraModel>.
    super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  else {
    local_248._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&updates;
    updates.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    updates.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    updates.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    rotVec.data = (uchar *)0x0;
    rotVec.flags = 0x1010000;
    transVec.data = (uchar *)0x0;
    transVec.flags = 0x1010000;
    fStack_1a8 = 0.0;
    fStack_1a4 = 0.0;
    local_1b8._0_4_ = 0x8103000d;
    uStack_240 = 0;
    local_250 = (PlanarLocalization *)CONCAT44(local_250._4_4_,0x8303000d);
    object_points.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    object_points.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(object_points.
                           super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,0x82030000);
    image_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)(image + 3);
    image_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    image_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(image_points.
                           super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,0x2010000);
    local_158 = 0x1500000015;
    local_228 = 0x1e00000003;
    uStack_220 = 0x3f847ae147ae147b;
    object_points.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)&image[2].step;
    rotVec._8_8_ = &image->step;
    unique0x10000b8f = (UMatData *)&image->allocator;
    cv::calcOpticalFlowPyrLK(0xeb1c432d);
    object_points.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    object_points.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    object_points.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    image_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    image_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    image_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (image->u != (UMatData *)image->allocator) {
      lVar5 = 0;
      lVar6 = 0;
      uVar4 = 0;
      do {
        if (*(char *)((long)image[2].step.p + uVar4) != '\0') {
          std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::push_back
                    (&object_points,(value_type *)(image->datastart + lVar5));
          std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::push_back
                    (&image_points,
                     (value_type *)
                     ((long)&(updates.
                              super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->x + lVar6));
        }
        uVar4 = uVar4 + 1;
        lVar6 = lVar6 + 8;
        lVar5 = lVar5 + 0xc;
      } while (uVar4 < (ulong)((long)image->u - (long)image->allocator >> 3));
    }
    cv::Mat::Mat(&rotVec);
    cv::Mat::Mat(&transVec);
    std::vector<int,_std::allocator<int>_>::vector
              (&inliers,(long)image_points.
                              super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)image_points.
                              super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3,
               (allocator_type *)local_1b8);
    local_1d0.sz.width = 0;
    local_1d0.sz.height = 0;
    local_1d0.flags = -0x7efcffeb;
    local_1d0.obj = &object_points;
    local_1e8.sz.width = 0;
    local_1e8.sz.height = 0;
    local_1e8.flags = -0x7efcfff3;
    local_1e8.obj = &image_points;
    CameraUser::getCameraModel((CameraUser *)image);
    CameraModel::getIntrinsics(local_278);
    local_268.flags = -0x3efdfffb;
    local_268.sz.width = 3;
    local_268.sz.height = 3;
    local_268.obj = &local_250;
    CameraUser::getCameraModel((CameraUser *)image);
    CameraModel::getDistortion((Mat *)local_1b8,local_288);
    local_48.sz.width = 0;
    local_48.sz.height = 0;
    local_48.flags = 0x1010000;
    local_60.super__InputArray.sz.width = 0;
    local_60.super__InputArray.sz.height = 0;
    local_60.super__InputArray.flags = 0x2010000;
    local_78.super__InputArray.sz.width = 0;
    local_78.super__InputArray.sz.height = 0;
    local_78.super__InputArray.flags = 0x2010000;
    local_90.super__InputArray.sz.width = 0;
    local_90.super__InputArray.sz.height = 0;
    local_90.super__InputArray.flags = -0x7dfcfffc;
    local_90.super__InputArray.obj = &inliers;
    local_78.super__InputArray.obj = &transVec;
    local_60.super__InputArray.obj = &rotVec;
    local_48.obj = (Mat *)local_1b8;
    cv::solvePnPRansac(&local_1d0,&local_1e8,&local_268,&local_48,&local_60,&local_78,false,0x96,1.0
                       ,0.9900000095367432,&local_90,0);
    cv::Mat::~Mat((Mat *)local_1b8);
    if (local_280 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_280);
    }
    if (local_270 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_270);
    }
    if ((ulong)((long)inliers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)inliers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start) < 0x28) {
      (this->super_CameraUser)._vptr_CameraUser = (_func_int **)0x0;
      (this->super_CameraUser).camera.super_shared_ptr<ary::CameraModel>.
      super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    }
    else {
      if ((MatAllocator *)image->u != image->allocator) {
        image->u = (UMatData *)image->allocator;
      }
      if (image->dataend != image->datastart) {
        image->dataend = image->datastart;
      }
      if (inliers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          inliers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        uVar4 = 0;
        do {
          std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::push_back
                    ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                     &image->allocator,
                     image_points.
                     super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start +
                     inliers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar4]);
          std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::push_back
                    ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                     &image->datastart,
                     object_points.
                     super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start +
                     inliers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar4]);
          uVar4 = uVar4 + 1;
        } while (uVar4 < (ulong)((long)inliers.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                       .super__Vector_impl_data._M_finish -
                                 (long)inliers.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                       .super__Vector_impl_data._M_start >> 2));
      }
      fStack_1a8 = 0.0;
      fStack_1a4 = 0.0;
      local_1b8._0_4_ = 0x2010000;
      unique0x10000b97 = (UMatData *)&image->step;
      cv::Mat::copyTo((_OutputArray *)in_RDX._M_pi);
      fStack_1a8 = SUB84(image[4].data,0);
      fStack_1a4 = (float)((ulong)image[4].data >> 0x20);
      local_1b8._0_8_ = *(undefined8 *)(image + 4);
      uVar1 = image[4].rows;
      uVar2 = image[4].cols;
      local_1b8._8_4_ = uVar1;
      fStack_1ac = (float)uVar2;
      MVar8 = cv::Mat::operator_cast_to_Matx(&transVec);
      fStack_1a4 = MVar8.val[2];
      fStack_1ac = MVar8.val[0];
      fStack_1a8 = MVar8.val[1];
      MVar8 = cv::Mat::operator_cast_to_Matx(&rotVec);
      local_1b8._8_4_ = MVar8.val[2];
      local_1b8._0_8_ = MVar8.val._0_8_;
      this_00 = (PlanarLocalization *)operator_new(0x48);
      local_2d0.width = (float)*(int *)&image[4].allocator;
      local_2d0.height = (float)*(int *)((long)&image[4].allocator + 4);
      id = *(int *)((long)&image[4].u + 4);
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
                (&local_200,
                 (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                 &image[4].datastart);
      PlanarLocalization::PlanarLocalization
                (this_00,id,(CameraPosition *)local_1b8,&local_2d0,&local_200,1.0);
      local_250 = this_00;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ary::PlanarLocalization*>
                (&local_248,this_00);
      _Var3._M_pi = local_248._M_pi;
      (this->super_CameraUser)._vptr_CameraUser = (_func_int **)local_250;
      (this->super_CameraUser).camera.super_shared_ptr<ary::CameraModel>.
      super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      local_248._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->super_CameraUser).camera.super_shared_ptr<ary::CameraModel>.
      super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_Var3._M_pi;
      local_250 = (PlanarLocalization *)0x0;
      if (local_200.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_200.
                        super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
    }
    if (inliers.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(inliers.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    cv::Mat::~Mat(&transVec);
    cv::Mat::~Mat(&rotVec);
    in_RDX._M_pi = extraout_RDX;
    if (image_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(image_points.
                      super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start);
      in_RDX._M_pi = extraout_RDX_00;
    }
    if (object_points.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(object_points.
                      super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start);
      in_RDX._M_pi = extraout_RDX_01;
    }
    if (updates.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(updates.
                      super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start);
      in_RDX._M_pi = extraout_RDX_02;
    }
  }
  SVar7.super_shared_ptr<ary::Localization>.
  super___shared_ptr<ary::Localization,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi
  ;
  SVar7.super_shared_ptr<ary::Localization>.
  super___shared_ptr<ary::Localization,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SharedLocalization)
         SVar7.super_shared_ptr<ary::Localization>.
         super___shared_ptr<ary::Localization,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedLocalization PlaneTracker::update(const Mat& image) {

    age++;

	if (keypoints_current.size() < 10)
		return Ptr<Localization>();

	vector<Point2f> updates;
	calcOpticalFlowPyrLK(previous, image, keypoints_current, updates, status, errors);

	vector<Point3f> object_points;
	vector<Point2f> image_points;

	for (int i = 0; i < keypoints_current.size(); i++) {
		if (status[i]) {
			object_points.push_back(keypoints_start[i]);
			image_points.push_back(updates[i]);
		}
	}

	Mat rotVec;
	Mat transVec;

	vector<int> inliers(image_points.size());

	solvePnPRansac(object_points, image_points, getCameraModel()->getIntrinsics(), getCameraModel()->getDistortion(), rotVec, transVec, false, 150, 1, 0.99f, inliers);


	if (inliers.size() < 10)
		return Ptr<Localization>();

	keypoints_current.clear();
	keypoints_start.clear();
	for (int i = 0; i < inliers.size(); i++) {
		keypoints_current.push_back(image_points[inliers[i]]);
		keypoints_start.push_back(object_points[inliers[i]]);
	}

	image.copyTo(previous);

	CameraPosition updated_camera = camera;

	updated_camera.translation = Matx31f(transVec);
	updated_camera.rotation = Matx31f(rotVec);

/*
	vector<Point2f> image_points2;
	projectPoints(keypoints_start, updated_camera.rotation, updated_camera.translation, getCameraModel()->getIntrinsics(), getCameraModel()->getDistortion(), image_points2);

	Mat test;
	image.copyTo(test);

	for (int i = 0; i < keypoints_start.size(); i++) {
		line(test, image_points2[i], keypoints_current[i], Scalar(255), 2);
	//cout <<  keypoints_current[i] << image_points2[i] << keypoints_start[i] << endl;

	}

	imshow("Test", test);
	//waitKey(0);
*/

	return Ptr<PlanarLocalization>(new PlanarLocalization(identifier, updated_camera, plane_size, plane_corners));
}